

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clone.cpp
# Opt level: O0

void __thiscall
Clone_componentWithChildren_Test::~Clone_componentWithChildren_Test
          (Clone_componentWithChildren_Test *this)

{
  Clone_componentWithChildren_Test *this_local;
  
  ~Clone_componentWithChildren_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Clone, componentWithChildren)
{
    auto c = libcellml::Component::create();
    auto c1 = libcellml::Component::create();
    auto c2 = libcellml::Component::create();

    c->setId("unique");
    c->setName("copy");

    c->addComponent(c1);
    c->addComponent(c2);

    auto cClone = c->clone();

    compareComponent(c, cClone);
}